

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstTestT<unsigned_int>(void)

{
  int iVar1;
  
  if (ConstTestT<unsigned_int>()::t == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstTestT<unsigned_int>()::t);
    if (iVar1 != 0) {
      ConstTestT<unsigned_int>::t = ConstConstructor<unsigned_int>();
      __cxa_guard_release(&ConstTestT<unsigned_int>()::t);
    }
  }
  if (ConstTestT<unsigned_int>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstTestT<unsigned_int>()::b);
    if (iVar1 != 0) {
      ConstTestT<unsigned_int>::b = ConstBool<unsigned_int>();
      __cxa_guard_release(&ConstTestT<unsigned_int>()::b);
    }
  }
  return;
}

Assistant:

void ConstTestT()
	{
		static const T t = ConstConstructor<T>();
		static const bool b = ConstBool<T>();
	}